

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_property.c
# Opt level: O1

int mpt_graph_set(mpt_graph *gr,char *name,mpt_convertable *src)

{
  int iVar1;
  uint uVar2;
  mpt_graph *in_RAX;
  mpt_color *pmVar3;
  mpt_graph *from;
  mpt_graph *local_28;
  
  local_28 = in_RAX;
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      return -4;
    }
    iVar1 = mpt_graph_pointer_typeid::ptype;
    if ((mpt_graph_pointer_typeid::ptype == 0) &&
       (iVar1 = mpt_type_add(&mpt_graph_pointer_typeid::traits), 0 < iVar1)) {
      mpt_graph_pointer_typeid::ptype = iVar1;
    }
    if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)iVar1,&local_28), -1 < iVar1)
       ) {
      free(gr->_axes);
      free(gr->_worlds);
      (gr->scale).x = 1.0;
      (gr->scale).y = 1.0;
      gr->grid = '\0';
      gr->align = '\0';
      gr->frame = '\0';
      gr->clip = '\0';
      gr->lpos = '\0';
      *(undefined3 *)&gr->field_0x2d = 0;
      (gr->fg).alpha = 0xff;
      (gr->fg).red = '\0';
      (gr->fg).green = '\0';
      (gr->fg).blue = '\0';
      (gr->bg).alpha = '\0';
      (gr->bg).red = 0xff;
      (gr->bg).green = 0xff;
      (gr->bg).blue = 0xff;
      (gr->pos).x = 0.0;
      (gr->pos).y = 0.0;
      gr->_axes = (char *)0x0;
      gr->_worlds = (char *)0x0;
      if (iVar1 == 0) {
        local_28 = (mpt_graph *)0x0;
      }
      mpt_graph_init(gr,local_28);
      return 0;
    }
    iVar1 = mpt_color_typeid();
    if (iVar1 < 1) {
      return -3;
    }
    pmVar3 = &gr->fg;
    iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)iVar1,pmVar3);
    if (iVar1 < 0) {
      return -3;
    }
    if (iVar1 != 0) {
      return 0;
    }
    pmVar3->alpha = 0xff;
    pmVar3->red = '\0';
    pmVar3->green = '\0';
    pmVar3->blue = '\0';
    return 0;
  }
  if (*name == '\0') {
    if (src != (mpt_convertable *)0x0) {
      iVar1 = mpt_graph_pointer_typeid::ptype;
      if ((mpt_graph_pointer_typeid::ptype == 0) &&
         (iVar1 = mpt_type_add(&mpt_graph_pointer_typeid::traits), 0 < iVar1)) {
        mpt_graph_pointer_typeid::ptype = iVar1;
      }
      if (iVar1 < 1) {
        return -3;
      }
      iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)iVar1,&local_28);
      if (iVar1 < 0) {
        return -3;
      }
      free(gr->_axes);
      free(gr->_worlds);
      (gr->scale).x = 1.0;
      (gr->scale).y = 1.0;
      gr->grid = '\0';
      gr->align = '\0';
      gr->frame = '\0';
      gr->clip = '\0';
      gr->lpos = '\0';
      *(undefined3 *)&gr->field_0x2d = 0;
      (gr->fg).alpha = 0xff;
      (gr->fg).red = '\0';
      (gr->fg).green = '\0';
      (gr->fg).blue = '\0';
      (gr->bg).alpha = '\0';
      (gr->bg).red = 0xff;
      (gr->bg).green = 0xff;
      (gr->bg).blue = 0xff;
      (gr->pos).x = 0.0;
      (gr->pos).y = 0.0;
      gr->_axes = (char *)0x0;
      gr->_worlds = (char *)0x0;
      mpt_graph_init(gr,local_28);
      if (0 < iVar1) {
        return 1;
      }
      return iVar1;
    }
    free(gr->_axes);
    free(gr->_worlds);
    (gr->scale).x = 1.0;
    (gr->scale).y = 1.0;
    gr->grid = '\0';
    gr->align = '\0';
    gr->frame = '\0';
    gr->clip = '\0';
    gr->lpos = '\0';
    *(undefined3 *)&gr->field_0x2d = 0;
    (gr->fg).alpha = 0xff;
    (gr->fg).red = '\0';
    (gr->fg).green = '\0';
    (gr->fg).blue = '\0';
    (gr->bg).alpha = '\0';
    (gr->bg).red = 0xff;
    (gr->bg).green = 0xff;
    (gr->bg).blue = 0xff;
    (gr->pos).x = 0.0;
    (gr->pos).y = 0.0;
    gr->_axes = (char *)0x0;
    gr->_worlds = (char *)0x0;
  }
  else {
    iVar1 = strcmp(name,"fg");
    if ((iVar1 == 0) || (iVar1 = strcasecmp(name,"foreground"), iVar1 == 0)) {
      pmVar3 = &gr->fg;
      if (src != (mpt_convertable *)0x0) {
LAB_00106959:
        iVar1 = mpt_color_pset(pmVar3,src);
        return iVar1;
      }
      pmVar3->alpha = 0xff;
      pmVar3->red = '\0';
      pmVar3->green = '\0';
      pmVar3->blue = '\0';
    }
    else {
      iVar1 = strcmp(name,"bg");
      if ((iVar1 == 0) || (iVar1 = strcasecmp(name,"background"), iVar1 == 0)) {
        pmVar3 = &gr->bg;
        if (src != (mpt_convertable *)0x0) goto LAB_00106959;
        pmVar3->alpha = '\0';
        pmVar3->red = 0xff;
        pmVar3->green = 0xff;
        pmVar3->blue = 0xff;
      }
      else {
        iVar1 = strcmp(name,"pos");
        if ((iVar1 == 0) || (iVar1 = strcasecmp(name,"position"), iVar1 == 0)) {
          if ((src != (mpt_convertable *)0x0) &&
             (uVar2 = mpt_fpoint_set(&gr->pos,src,&mpt_graph_set::r), uVar2 != 0)) {
LAB_001069c9:
            return (int)uVar2 >> 0x1f & uVar2;
          }
          (gr->pos).x = 0.0;
          (gr->pos).y = 0.0;
        }
        else {
          iVar1 = strcasecmp(name,"scale");
          if (iVar1 == 0) {
            if ((src != (mpt_convertable *)0x0) &&
               (iVar1 = mpt_fpoint_set(&gr->scale,src,&mpt_graph_set::r_1), iVar1 != 0)) {
              return iVar1;
            }
            (gr->scale).x = 1.0;
            (gr->scale).y = 1.0;
          }
          else {
            iVar1 = strcmp(name,"type");
            if ((iVar1 == 0) || (iVar1 = strcasecmp(name,"gridtype"), iVar1 == 0)) {
              if ((src != (mpt_convertable *)0x0) &&
                 (uVar2 = (*src->_vptr->convert)(src,99,&gr->grid), uVar2 != 0)) goto LAB_001069c9;
              gr->grid = '\0';
            }
            else {
              iVar1 = strcmp(name,"align");
              if ((iVar1 == 0) || (iVar1 = strcasecmp(name,"alignment"), iVar1 == 0)) {
                if ((src == (mpt_convertable *)0x0) ||
                   (iVar1 = (*src->_vptr->convert)(src,0x79,&gr->align), iVar1 == 0)) {
                  gr->align = '\0';
                }
              }
              else {
                iVar1 = strcmp(name,"clip");
                if ((iVar1 == 0) || (iVar1 = strcasecmp(name,"clipping"), iVar1 == 0)) {
                  if ((src == (mpt_convertable *)0x0) ||
                     (iVar1 = (*src->_vptr->convert)(src,0x79,&gr->clip), iVar1 == 0)) {
                    gr->clip = '\0';
                  }
                }
                else {
                  iVar1 = strcmp(name,"lpos");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(name,"axes");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(name,"worlds");
                      if (iVar1 != 0) {
                        return -1;
                      }
                      gr = (mpt_graph *)&gr->_worlds;
                    }
                    if (src == (mpt_convertable *)0x0) {
                      mpt_string_set(&gr->_axes,(char *)0x0,0);
                      return 0;
                    }
                    iVar1 = mpt_string_pset(&gr->_axes,src);
                    return iVar1;
                  }
                  if ((src != (mpt_convertable *)0x0) &&
                     (uVar2 = (*src->_vptr->convert)(src,99,&gr->lpos), uVar2 != 0))
                  goto LAB_001069c9;
                  gr->lpos = '\0';
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

extern int mpt_graph_set(MPT_STRUCT(graph) *gr, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		const MPT_STRUCT(graph) *from;
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_graph_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_graph_fini(gr);
			mpt_graph_init(gr, len ? from : 0);
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &gr->fg)) >= 0) {
			if (!len) gr->fg = def_graph.fg;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		const MPT_STRUCT(graph) *from;
		int type;
		
		if (!src) {
			mpt_graph_fini(gr);
			return 0;
		}
		if ((type = mpt_graph_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_graph_fini(gr);
			mpt_graph_init(gr, from);
			return len <= 0 ? len : 1;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcmp(name, "fg") || !strcasecmp(name, "foreground")) {
		if (!src) {
			gr->fg = def_graph.fg;
			return 0;
		}
		return mpt_color_pset(&gr->fg, src);
	}
	if (!strcmp(name, "bg") || !strcasecmp(name, "background")) {
		if (!src) {
			gr->bg = def_graph.bg;
			return 0;
		}
		return mpt_color_pset(&gr->bg, src);
	}
	if (!strcmp(name, "pos") || !strcasecmp(name, "position")) {
		static const MPT_STRUCT(range) r = { 0.0, 1.0 };
		if (!src || !(len = mpt_fpoint_set(&gr->pos, src, &r))) {
			gr->pos = def_graph.pos;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "scale")) {
		static const MPT_STRUCT(range) r = { 0.0, FLT_MAX };
		if (!src || !(len = mpt_fpoint_set(&gr->scale, src, &r))) {
			gr->scale = def_graph.scale;
			return 0;
		}
		return len;
	}
	if (!strcmp(name, "type") || !strcasecmp(name, "gridtype")) {
		if (!src || !(len = src->_vptr->convert(src, 'c', &gr->grid))) {
			gr->grid = def_graph.grid;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcmp(name, "align") || !strcasecmp(name, "alignment")) {
		const char *v;
		uint8_t n = 0;
		int i = 0;
		
		if (!src || !(len = src->_vptr->convert(src, 'y', &gr->align))) {
			gr->align = def_graph.align;
			return 0;
		}
		if (len) {
			return 0;
		}
		if ((len = src->_vptr->convert(src, 's', &v)) < 0) {
			return len;
		}
		if (!len || !v) {
			n = 0;
		}
		else while (v[i]) {
			if (i >= 4) {
				break;
			}
			switch (v[i++]) {
			  case 0: len = i - 1; break;
			  case 'B': case 'b': n |= MPT_ENUM(AlignBegin) << i*2; break;
			  case 'E': case 'e': n |= MPT_ENUM(AlignEnd)   << i*2; break;
			  case 'Z': case 'z': n |= MPT_ENUM(AlignZero)  << i*2; break;
			  default:;
			}
		}
		gr->align = n;
		
		return 0;
	}
	if (!strcmp(name, "clip") || !strcasecmp(name, "clipping")) {
		const char *v;
		uint8_t n = 0;
		
		if (!src || !(len = src->_vptr->convert(src, 'y', &gr->clip))) {
			gr->clip = def_graph.clip;
			return 0;
		}
		if (len) {
			return 0;
		}
		if ((len = src->_vptr->convert(src, 's', &v)) < 0) {
			return len;
		}
		if (!len || !v) {
			gr->clip = def_graph.clip;
			return 0;
		}
		while (*v) {
			switch (*v++) {
			  case 'x': n |= 1; break;
			  case 'y': n |= 2; break;
			  case 'z': n |= 4; break;
			  default:  n |= 8;
			}
		}
		gr->clip = n;
		return 0;
	}
	if (!strcmp(name, "lpos")) {
		if (!src || !(len = src->_vptr->convert(src, 'c', &gr->lpos))) {
			gr->lpos = def_graph.lpos;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcmp(name, "axes")) {
		if (!src) {
			mpt_string_set(&gr->_axes, 0, 0);
			return 0;
		}
		return mpt_string_pset(&gr->_axes, src);
	}
	if (!strcmp(name, "worlds")) {
		if (!src) {
			mpt_string_set(&gr->_worlds, 0, 0);
			return 0;
		}
		return mpt_string_pset(&gr->_worlds, src);
	}
	return MPT_ERROR(BadArgument);
}